

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderIndexingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderIndexingCase::setupUniforms
          (ShaderIndexingCase *this,int programID,Vec4 *constCoords)

{
  int iVar1;
  undefined4 extraout_var;
  TestError *this_00;
  int i;
  long lVar3;
  Vector<float,_3> res;
  float arr [4];
  float local_88 [4];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  long lVar2;
  
  iVar1 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  iVar1 = (**(code **)(lVar2 + 0xb48))(programID,"u_arr");
  if (iVar1 != -1) {
    switch(this->m_varType) {
    case TYPE_FLOAT:
      local_68._0_4_ = constCoords->m_data[0];
      local_68._4_4_ = (float)local_68._0_4_ * 0.5;
      fStack_60 = (float)local_68._0_4_ * 0.25;
      fStack_5c = (float)local_68._0_4_ * 0.125;
      (**(code **)(lVar2 + 0x14e8))(iVar1,4);
      break;
    case TYPE_FLOAT_VEC2:
      local_88[0] = constCoords->m_data[0];
      local_88[1] = constCoords->m_data[1];
      local_68 = *(undefined1 (*) [8])constCoords->m_data;
      local_78 = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_78 + lVar3 * 4) = local_88[lVar3] * 0.5;
        lVar3 = lVar3 + 1;
      } while (lVar3 == 1);
      fStack_60 = (float)local_78;
      fStack_5c = (float)((ulong)local_78 >> 0x20);
      local_78 = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_78 + lVar3 * 4) = local_88[lVar3] * 0.25;
        lVar3 = lVar3 + 1;
      } while (lVar3 == 1);
      aStack_58._M_allocated_capacity._0_4_ = (undefined4)local_78;
      aStack_58._M_allocated_capacity._4_4_ = (undefined4)((ulong)local_78 >> 0x20);
      local_78 = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_78 + lVar3 * 4) = local_88[lVar3] * 0.125;
        lVar3 = lVar3 + 1;
      } while (lVar3 == 1);
      aStack_58._8_8_ = local_78;
      (**(code **)(lVar2 + 0x1528))(iVar1,4);
      break;
    case TYPE_FLOAT_VEC3:
      local_88[0] = constCoords->m_data[0];
      local_88[1] = constCoords->m_data[1];
      local_68 = *(undefined1 (*) [8])constCoords->m_data;
      fStack_60 = constCoords->m_data[2];
      local_88[2] = fStack_60;
      local_78 = 0;
      uStack_70._0_4_ = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_78 + lVar3 * 4) = local_88[lVar3] * 0.5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      aStack_58._M_allocated_capacity._4_4_ = (undefined4)uStack_70;
      fStack_5c = (float)local_78;
      aStack_58._M_allocated_capacity._0_4_ = (undefined4)((ulong)local_78 >> 0x20);
      local_78 = 0;
      uStack_70._0_4_ = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_78 + lVar3 * 4) = local_88[lVar3] * 0.25;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      local_48 = (undefined4)uStack_70;
      aStack_58._8_8_ = local_78;
      local_78 = 0;
      uStack_70 = (ulong)uStack_70._4_4_ << 0x20;
      lVar3 = 0;
      do {
        *(float *)((long)&local_78 + lVar3 * 4) = local_88[lVar3] * 0.125;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      uStack_3c = (undefined4)uStack_70;
      uStack_44 = (undefined4)local_78;
      uStack_40 = (undefined4)((ulong)local_78 >> 0x20);
      (**(code **)(lVar2 + 0x1568))(iVar1,4);
      break;
    case TYPE_FLOAT_VEC4:
      local_88[0] = constCoords->m_data[0];
      local_88[1] = constCoords->m_data[1];
      local_68 = *(undefined1 (*) [8])constCoords->m_data;
      fStack_60 = constCoords->m_data[2];
      fStack_5c = constCoords->m_data[3];
      local_88[2] = fStack_60;
      local_88[3] = fStack_5c;
      local_78 = 0;
      uStack_70 = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_78 + lVar3 * 4) = local_88[lVar3] * 0.5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      aStack_58._M_allocated_capacity._0_4_ = (undefined4)local_78;
      aStack_58._M_allocated_capacity._4_4_ = (undefined4)((ulong)local_78 >> 0x20);
      aStack_58._8_8_ = uStack_70;
      local_78 = 0;
      uStack_70 = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_78 + lVar3 * 4) = local_88[lVar3] * 0.25;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_48 = (undefined4)local_78;
      uStack_44 = local_78._4_4_;
      uStack_40 = (undefined4)uStack_70;
      uStack_3c = uStack_70._4_4_;
      local_78 = 0;
      uStack_70 = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_78 + lVar3 * 4) = local_88[lVar3] * 0.125;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_38 = local_78;
      uStack_30 = uStack_70;
      (**(code **)(lVar2 + 0x15a8))(iVar1,4);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      local_68 = (undefined1  [8])&aStack_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"u_arr should not have location assigned in this test case","");
      tcu::TestError::TestError(this_00,(string *)local_68);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

void ShaderIndexingCase::setupUniforms (int programID, const Vec4& constCoords)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	DE_UNREF(constCoords);

	int arrLoc = gl.getUniformLocation(programID, "u_arr");
	if (arrLoc != -1)
	{
		//int scalarSize = getDataTypeScalarSize(m_varType);
		if (m_varType == TYPE_FLOAT)
		{
			float arr[4];
			arr[0] = constCoords.x();
			arr[1] = constCoords.x() * 0.5f;
			arr[2] = constCoords.x() * 0.25f;
			arr[3] = constCoords.x() * 0.125f;
			gl.uniform1fv(arrLoc, 4, &arr[0]);
		}
		else if (m_varType == TYPE_FLOAT_VEC2)
		{
			Vec2 arr[4];
			arr[0] = constCoords.swizzle(0,1);
			arr[1] = constCoords.swizzle(0,1) * 0.5f;
			arr[2] = constCoords.swizzle(0,1) * 0.25f;
			arr[3] = constCoords.swizzle(0,1) * 0.125f;
			gl.uniform2fv(arrLoc, 4, arr[0].getPtr());
		}
		else if (m_varType == TYPE_FLOAT_VEC3)
		{
			Vec3 arr[4];
			arr[0] = constCoords.swizzle(0,1,2);
			arr[1] = constCoords.swizzle(0,1,2) * 0.5f;
			arr[2] = constCoords.swizzle(0,1,2) * 0.25f;
			arr[3] = constCoords.swizzle(0,1,2) * 0.125f;
			gl.uniform3fv(arrLoc, 4, arr[0].getPtr());
		}
		else if (m_varType == TYPE_FLOAT_VEC4)
		{
			Vec4 arr[4];
			arr[0] = constCoords.swizzle(0,1,2,3);
			arr[1] = constCoords.swizzle(0,1,2,3) * 0.5f;
			arr[2] = constCoords.swizzle(0,1,2,3) * 0.25f;
			arr[3] = constCoords.swizzle(0,1,2,3) * 0.125f;
			gl.uniform4fv(arrLoc, 4, arr[0].getPtr());
		}
		else
			throw tcu::TestError("u_arr should not have location assigned in this test case");
	}
}